

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O1

RC __thiscall
QL_Manager::InsertIntoRelation
          (QL_Manager *this,char *relName,int tupleLength,int nValues,Value *values)

{
  AttrCatEntry *pAVar1;
  RC RVar2;
  DataAttrInfo *pDVar3;
  char *pData;
  void **ppvVar4;
  long lVar5;
  RID recRID;
  Printer printer;
  RM_FileHandle relFH;
  RID local_c0;
  int local_b4;
  RID local_b0;
  DataAttrInfo *local_a8;
  Printer local_a0;
  RM_FileHandle local_78;
  
  local_b4 = tupleLength;
  pDVar3 = (DataAttrInfo *)malloc((long)this->relEntries->attrCount * 0x44);
  SetUpPrinterInsert(this,pDVar3);
  Printer::Printer(&local_a0,pDVar3,this->relEntries->attrCount);
  Printer::PrintHeader(&local_a0,(ostream *)&std::cout);
  RM_FileHandle::RM_FileHandle(&local_78);
  RVar2 = RM_Manager::OpenFile(this->rmm,relName,&local_78);
  if (RVar2 != 0) goto LAB_00110bb6;
  local_a8 = pDVar3;
  pData = (char *)malloc((long)local_b4);
  if (0 < nValues) {
    pAVar1 = this->attrEntries;
    ppvVar4 = &values->data;
    lVar5 = 0;
    do {
      memcpy(pData + *(int *)(pAVar1->attrName + lVar5 + 0x1b),*ppvVar4,
             (long)*(int *)(pAVar1->attrName + lVar5 + 0x23));
      lVar5 = lVar5 + 0x54;
      ppvVar4 = ppvVar4 + 2;
    } while ((ulong)(uint)nValues * 0x54 - lVar5 != 0);
  }
  RID::RID(&local_c0);
  RVar2 = RM_FileHandle::InsertRec(&local_78,pData,&local_c0);
  pDVar3 = local_a8;
  if (RVar2 == 0) {
    Printer::Print(&local_a0,(ostream *)&std::cout,pData);
    local_b0 = local_c0;
    RVar2 = InsertIntoIndex(this,pData,&local_b0);
    RID::~RID(&local_b0);
    if (RVar2 != 0) goto LAB_00110ba4;
    Printer::PrintFooter(&local_a0,(ostream *)&std::cout);
    free(pData);
    free(pDVar3);
    RVar2 = RM_Manager::CloseFile(this->rmm,&local_78);
  }
  else {
LAB_00110ba4:
    free(pData);
  }
  RID::~RID(&local_c0);
LAB_00110bb6:
  RM_FileHandle::~RM_FileHandle(&local_78);
  Printer::~Printer(&local_a0);
  return RVar2;
}

Assistant:

RC QL_Manager::InsertIntoRelation(const char *relName, int tupleLength, int nValues, const Value values[]){
  // Open relation
  RC rc = 0;
  
  // Creates the attribute setup for printing
  DataAttrInfo * printAttributes = (DataAttrInfo *)malloc(relEntries->attrCount* sizeof(DataAttrInfo));
  if((rc = SetUpPrinterInsert(printAttributes)))
    return (rc);
  Printer printer(printAttributes, relEntries->attrCount);
  printer.PrintHeader(cout);

  // Open the appropriate file
  RM_FileHandle relFH;
  if((rc = rmm.OpenFile(relName, relFH))){
    return (rc);
  }
  char *recbuf = (char *)malloc(tupleLength);

  // Create record
  CreateRecord(recbuf, attrEntries, nValues, values);

  // Insert into relation
  RID recRID;
  if((rc = relFH.InsertRec(recbuf, recRID))){
    free(recbuf);
    return (rc);
  }
  printer.Print(cout, recbuf);
  // Insert into any indices in the relation
  if((rc = InsertIntoIndex(recbuf, recRID))){
    free(recbuf);
    return (rc);
  }

  printer.PrintFooter(cout);
  free(recbuf);
  free(printAttributes);
  // Close relation, clean up
  rc = rmm.CloseFile(relFH);
  return (rc);

}